

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

HelicsTranslator helicsFederateGetTranslator(HelicsFederate fed,char *name,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  HelicsError *in_RDX;
  long in_RSI;
  string_view in_stack_00000000;
  Translator *in_stack_00000030;
  Translator *id;
  shared_ptr<helics::Federate> fedObj;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  __shared_ptr local_30 [16];
  HelicsError *local_20;
  long local_18;
  Federate *in_stack_fffffffffffffff8;
  HelicsTranslator pvVar2;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    if (local_18 == 0) {
      assignError(local_20,-4,"The supplied string argument is null and therefore invalid");
      pvVar2 = (HelicsTranslator)0x0;
    }
    else {
      this = std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ebd77);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      helics::Federate::getTranslator(in_stack_fffffffffffffff8,in_stack_00000000);
      bVar1 = helics::Interface::isValid((Interface *)0x1ebdba);
      if (bVar1) {
        pvVar2 = findOrCreateFederateTranslator(id,in_stack_00000030);
      }
      else {
        local_20->error_code = -4;
        local_20->message = "the specified Translator name is not recognized";
        pvVar2 = (HelicsTranslator)0x0;
      }
    }
  }
  else {
    pvVar2 = (HelicsTranslator)0x0;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1ebe71);
  return pvVar2;
}

Assistant:

HelicsTranslator helicsFederateGetTranslator(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& id = fedObj->getTranslator(name);
        if (!id.isValid()) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = invalidTransName;
            return nullptr;
        }
        return findOrCreateFederateTranslator(fed, id);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}